

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O2

void adios2::helper::ParseConfigYAMLIO
               (ADIOS *adios,string *configFileYAML,string *configFileContents,IO *io)

{
  bool bVar1;
  __type _Var2;
  ADIOS *adios_00;
  allocator local_273;
  allocator local_272;
  allocator local_271;
  IO *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  string ioName;
  const_iterator itNode;
  string hint;
  Node ioScalar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string configFileContentsCopy;
  Node document;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffef0,"when parsing config file ",configFileYAML);
  std::operator+(&hint,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xfffffffffffffef0," in call to ADIOS constructor");
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  std::__cxx11::string::string((string *)&configFileContentsCopy,(string *)configFileContents);
  YAML::Load(&document,&configFileContentsCopy);
  bVar1 = YAML::Node::operator!(&document);
  if (bVar1) {
    std::__cxx11::string::string((string *)&stack0xfffffffffffffef0,"Helper",&local_271);
    std::__cxx11::string::string((string *)&ioScalar,"adiosYAML",&local_272);
    std::__cxx11::string::string((string *)&itNode,"ParseConfigYAML",&local_273);
    std::operator+(&local_1b0,"parser error in file ",configFileYAML);
    std::operator+(&local_190,&local_1b0,
                   " invalid format check with any YAML editor if format is ill-formed, ");
    std::operator+(&ioName,&local_190,&hint);
    Throw<std::invalid_argument>
              ((string *)&stack0xfffffffffffffef0,(string *)&ioScalar,(string *)&itNode,&ioName,-1);
    std::__cxx11::string::~string((string *)&ioName);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&itNode);
    std::__cxx11::string::~string((string *)&ioScalar);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  }
  YAML::Node::begin(&itNode,&document);
  local_268 = &io->m_Name;
  local_270 = io;
  do {
    YAML::Node::end((const_iterator *)&stack0xfffffffffffffef0,&document);
    bVar1 = YAML::detail::node_iterator_base<YAML::detail::node>::operator!=
                      (&itNode.m_iterator,
                       (node_iterator_base<YAML::detail::node> *)&stack0xfffffffffffffef0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff18);
    if (!bVar1) {
LAB_0047c42b:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&itNode.m_pMemory.
                  super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      YAML::Node::~Node(&document);
      std::__cxx11::string::~string((string *)&configFileContentsCopy);
      std::__cxx11::string::~string((string *)&hint);
      return;
    }
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,"IO",(allocator *)&ioName);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
              ((value_type *)&stack0xfffffffffffffef0,&itNode);
    anon_unknown_0::YAMLNode
              (&ioScalar,(string *)&stack0xffffffffffffffb0,(Node *)&stack0xfffffffffffffef0,&hint,
               false,Scalar);
    YAML::detail::iterator_value::~iterator_value((value_type *)&stack0xfffffffffffffef0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    if ((ioScalar.m_isValid == true) &&
       ((ioScalar.m_pNode == (node *)0x0 ||
        ((((((ioScalar.m_pNode)->m_pRef).
            super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData)
          .super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_isDefined == true)))) {
      YAML::Node::as<std::__cxx11::string>(&ioName,&ioScalar);
      _Var2 = std::operator==(&ioName,local_268);
      if (_Var2) {
        adios_00 = (ADIOS *)&stack0xfffffffffffffef0;
        YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
                  ((value_type *)adios_00,&itNode);
        IOYAML(adios_00,(Node *)&stack0xfffffffffffffef0,local_270,&hint);
        YAML::detail::iterator_value::~iterator_value((iterator_value *)&stack0xfffffffffffffef0);
        std::__cxx11::string::~string((string *)&ioName);
        YAML::Node::~Node(&ioScalar);
        goto LAB_0047c42b;
      }
      std::__cxx11::string::~string((string *)&ioName);
    }
    YAML::Node::~Node(&ioScalar);
    YAML::detail::node_iterator_base<YAML::detail::node>::operator++(&itNode.m_iterator);
  } while( true );
}

Assistant:

void ParseConfigYAMLIO(core::ADIOS &adios, const std::string &configFileYAML,
                       const std::string &configFileContents, core::IO &io)
{
    const std::string hint =
        "when parsing config file " + configFileYAML + " in call to ADIOS constructor";

    // the following copy is needed because YAML::Load modifies configFileContents
    const std::string configFileContentsCopy = configFileContents;
    const YAML::Node document = YAML::Load(configFileContentsCopy);

    if (!document)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosYAML", "ParseConfigYAML",
            "parser error in file " + configFileYAML +
                " invalid format check with any YAML editor if format is "
                "ill-formed, " +
                hint);
    }

    for (auto itNode = document.begin(); itNode != document.end(); ++itNode)
    {
        const YAML::Node ioScalar =
            YAMLNode("IO", *itNode, hint, isNotMandatory, YAML::NodeType::Scalar);
        if (ioScalar)
        {
            const std::string ioName = ioScalar.as<std::string>();
            if (ioName == io.m_Name)
            {
                IOYAML(adios, *itNode, io, hint);
                return;
            }
        }
    }
}